

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
linkedList<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
          (Earcut<unsigned_int> *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *points,
          bool clockwise)

{
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  Node *pNVar4;
  Node *pNVar5;
  float fVar6;
  pointer paVar7;
  Node *last;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  
  paVar2 = (points->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar3 = (points->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)paVar3 - (long)paVar2 >> 3;
  if (paVar3 != paVar2) {
    lVar9 = 0;
    lVar8 = lVar10 + -1;
    if (lVar10 == 0) {
      lVar8 = lVar9;
    }
    fVar6 = 0.0;
    fVar11 = paVar2[lVar8]._M_elems[0];
    fVar12 = paVar2[lVar8]._M_elems[1];
    do {
      paVar1 = paVar2 + lVar9;
      paVar7 = paVar2 + lVar9;
      fVar6 = fVar6 + (fVar12 + paVar7->_M_elems[1]) * (fVar11 - paVar1->_M_elems[0]);
      lVar9 = lVar9 + 1;
      fVar11 = paVar1->_M_elems[0];
      fVar12 = paVar7->_M_elems[1];
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar9);
    if (fVar6 <= 0.0 == clockwise) {
      if (paVar3 != paVar2) {
        last = (Node *)0x0;
        lVar8 = lVar10;
        lVar9 = lVar10 * 8;
        do {
          lVar8 = lVar8 + -1;
          last = insertNode<std::array<float,2ul>>
                           (this,this->vertices + lVar8,
                            (array<float,_2UL> *)
                            ((long)(points->
                                   super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[-1]._M_elems + lVar9),
                            last);
          lVar9 = lVar9 + -8;
        } while (lVar8 != 0);
        goto LAB_00148ab7;
      }
    }
    else if (paVar3 != paVar2) {
      lVar9 = 0;
      lVar8 = 0;
      last = (Node *)0x0;
      do {
        last = insertNode<std::array<float,2ul>>
                         (this,this->vertices + lVar8,
                          (array<float,_2UL> *)
                          ((long)((points->
                                  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9),
                          last);
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 8;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar8);
LAB_00148ab7:
      if (last != (Node *)0x0) {
        pNVar4 = last->next;
        if ((last->x == pNVar4->x) && (!NAN(last->x) && !NAN(pNVar4->x))) {
          if ((last->y == pNVar4->y) && (!NAN(last->y) && !NAN(pNVar4->y))) {
            pNVar5 = last->prev;
            pNVar4->prev = pNVar5;
            pNVar5->next = pNVar4;
            pNVar4 = last->prevZ;
            pNVar5 = last->nextZ;
            if (pNVar4 != (Node *)0x0) {
              pNVar4->nextZ = pNVar5;
            }
            if (pNVar5 != (Node *)0x0) {
              pNVar5->prevZ = pNVar4;
            }
            last = last->next;
          }
        }
        goto LAB_00148b0a;
      }
    }
  }
  last = (Node *)0x0;
LAB_00148b0a:
  this->vertices = this->vertices + lVar10;
  return last;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}